

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::binary_escape_string(string *string_to_escape)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  void *this;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  undefined8 in_RSI;
  char cVar7;
  string *in_RDI;
  size_type sqLoc;
  string code;
  stringstream stream;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *escaped_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  long local_2a8;
  allocator local_299;
  string local_298 [32];
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [48];
  stringstream local_1c0 [16];
  undefined1 local_1b0 [383];
  byte local_31;
  undefined8 local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  ::std::__cxx11::string::string((string *)in_RDI);
  local_20 = local_10;
  local_28._M_current = (char *)::std::__cxx11::string::begin();
  local_30 = ::std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd20,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd18);
    cVar7 = (char)in_RDI;
    if (!bVar1) break;
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
    local_31 = *pbVar3;
    iVar2 = isprint((uint)local_31);
    if (iVar2 == 0) {
      ::std::__cxx11::stringstream::stringstream(local_1c0);
      this = (void *)::std::ostream::operator<<(local_1b0,std::hex);
      ::std::ostream::operator<<(this,(uint)local_31);
      ::std::__cxx11::stringstream::str();
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_250,"\\x",&local_251);
      ::std::__cxx11::string::size();
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_210);
      ::std::__cxx11::string::~string(local_210);
      ::std::__cxx11::string::~string(local_230);
      ::std::__cxx11::string::~string(local_250);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
      ::std::__cxx11::string::~string(local_1f0);
      ::std::__cxx11::stringstream::~stringstream(local_1c0);
    }
    else if ((local_31 == 0x78) || (local_31 == 0x58)) {
      uVar4 = ::std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (pcVar5 = (char *)::std::__cxx11::string::back(), *pcVar5 == '\\'))
      {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_298,"\\x",&local_299);
        if (local_31 == 0x78) {
          in_stack_fffffffffffffd28 = "78";
        }
        else {
          in_stack_fffffffffffffd28 = "58";
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
        ::std::__cxx11::string::operator+=((string *)in_RDI,local_278);
        ::std::__cxx11::string::~string(local_278);
        ::std::__cxx11::string::~string(local_298);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
      }
      else {
        ::std::__cxx11::string::push_back(cVar7);
      }
    }
    else {
      ::std::__cxx11::string::push_back(cVar7);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  bVar1 = ::std::operator!=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (bVar1) {
    local_2a8 = ::std::__cxx11::string::find(cVar7,0x27);
    while (local_2a8 != -1) {
      puVar6 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar6 = 0x5c;
      ::std::__cxx11::string::insert((ulong)in_RDI,(char *)(local_2a8 + 1));
      local_2a8 = ::std::__cxx11::string::find(cVar7,0x27);
    }
    ::std::__cxx11::string::insert((ulong)in_RDI,(char *)0x0);
    ::std::__cxx11::string::push_back(cVar7);
    ::std::__cxx11::string::push_back(cVar7);
    ::std::__cxx11::string::push_back(cVar7);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;
        } else if(c == 'x' || c == 'X') {
            // need to check for inadvertent binary sequences
            if(!escaped_string.empty() && escaped_string.back() == '\\') {
                escaped_string += std::string("\\x") + (c == 'x' ? "78" : "58");
            } else {
                escaped_string.push_back(c);
            }

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}